

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

void __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::setChild
          (SeparatedSyntaxList<slang::syntax::MemberSyntax> *this,size_t index,TokenOrSyntax child)

{
  _Variadic_union<const_slang::syntax::SyntaxNode_*> *p_Var1;
  size_t index_local;
  SeparatedSyntaxList<slang::syntax::MemberSyntax> *this_local;
  
  p_Var1 = (_Variadic_union<const_slang::syntax::SyntaxNode_*> *)
           nonstd::span_lite::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::operator[]
                     (&this->elements,index);
  *p_Var1 = child.super_ConstTokenOrSyntax.
            super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
            super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
            super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
            super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
            super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
            super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
            super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
            _M_u._M_rest;
  p_Var1[1] = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)
              child.super_ConstTokenOrSyntax.
              super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
              super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
              super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
              super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
              super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
              super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
              super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
              ._M_u._M_first._M_storage.info;
  p_Var1[2]._M_rest =
       (_Variadic_union<>)
       child.super_ConstTokenOrSyntax.
       super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
       super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
       super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
       super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
       super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
       super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
       super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
       _M_index;
  return;
}

Assistant:

void setChild(size_t index, TokenOrSyntax child) final { elements[index] = child; }